

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O3

int P_Thing_Damage(int tid,AActor *whofor0,int amount,FName *type)

{
  int iVar1;
  int iVar2;
  AActor **ppAVar3;
  AActor *pAVar4;
  int iVar5;
  AActor *pAVar6;
  AActor *this;
  FName local_54;
  AActor *local_50;
  FName *local_48;
  AActor **local_40;
  DAngle local_38;
  
  if (tid == 0) {
    iVar5 = 0;
    if (whofor0 != (AActor *)0x0) {
      pAVar6 = (AActor *)0x0;
      this = whofor0;
LAB_00576f9a:
      local_40 = (AActor **)((long)AActor::TIDHash + (ulong)((tid & 0x7fU) << 3));
      iVar5 = 0;
      local_50 = whofor0;
      local_48 = type;
      do {
        if (tid != 0) {
          ppAVar3 = &pAVar6->inext;
          if (pAVar6 == (AActor *)0x0) {
            ppAVar3 = local_40;
          }
          for (pAVar4 = *ppAVar3; pAVar4 != (AActor *)0x0; pAVar4 = pAVar4->inext) {
            pAVar6 = pAVar4;
            if (pAVar4->tid == tid) goto LAB_00576fea;
          }
          pAVar6 = (AActor *)0x0;
        }
        pAVar4 = (AActor *)0x0;
LAB_00576fea:
        if (((this->flags).Value & 4) != 0) {
          if (amount < 1) {
            iVar2 = this->health;
            iVar1 = AActor::SpawnHealth(this);
            if (iVar2 < iVar1) {
              iVar1 = this->health - amount;
              this->health = iVar1;
              iVar2 = AActor::SpawnHealth(this);
              if (iVar2 < iVar1) {
                iVar2 = AActor::SpawnHealth(this);
                this->health = iVar2;
              }
              if (this->player != (player_t *)0x0) {
                this->player->health = this->health;
              }
            }
          }
          else {
            local_54.Index = local_48->Index;
            local_38.Degrees = 0.0;
            P_DamageMobj(this,(AActor *)0x0,local_50,amount,&local_54,0,&local_38);
          }
          iVar5 = iVar5 + 1;
        }
        this = pAVar4;
      } while (pAVar4 != (AActor *)0x0);
    }
  }
  else {
    iVar5 = 0;
    for (pAVar6 = AActor::TIDHash[tid & 0x7f]; pAVar6 != (AActor *)0x0; pAVar6 = pAVar6->inext) {
      this = pAVar6;
      if (pAVar6->tid == tid) goto LAB_00576f9a;
    }
  }
  return iVar5;
}

Assistant:

int P_Thing_Damage (int tid, AActor *whofor0, int amount, FName type)
{
	FActorIterator iterator (tid);
	int count = 0;
	AActor *actor;

	actor = (tid == 0 ? whofor0 : iterator.Next());
	while (actor)
	{
		AActor *next = tid == 0 ? NULL : iterator.Next ();
		if (actor->flags & MF_SHOOTABLE)
		{
			if (amount > 0)
			{
				P_DamageMobj (actor, NULL, whofor0, amount, type);
			}
			else if (actor->health < actor->SpawnHealth())
			{
				actor->health -= amount;
				if (actor->health > actor->SpawnHealth())
				{
					actor->health = actor->SpawnHealth();
				}
				if (actor->player != NULL)
				{
					actor->player->health = actor->health;
				}
			}
			count++;
		}
		actor = next;
	}
	return count;
}